

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

subindex * __thiscall merlin::subindex::operator++(subindex *this)

{
  vsize *pvVar1;
  vsize *pvVar2;
  bool *pbVar3;
  vsize *pvVar4;
  ulong uVar5;
  
  if (this->m_nd != 0) {
    pvVar1 = this->m_state;
    pvVar2 = this->m_dims;
    pbVar3 = this->m_skipped;
    pvVar4 = this->m_subtract;
    uVar5 = 0;
    do {
      if (pvVar1[uVar5] != pvVar2[uVar5]) {
        pvVar1[uVar5] = pvVar1[uVar5] + 1;
        if (this->m_skipped[uVar5] != false) {
          return this;
        }
        this->m_idx = this->m_idx + this->m_add[uVar5];
        return this;
      }
      pvVar1[uVar5] = 1;
      if (pbVar3[uVar5] == false) {
        this->m_idx = this->m_idx - pvVar4[uVar5];
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_nd);
  }
  return this;
}

Assistant:

subindex& operator++(void) {
		for (size_t i = 0; i < m_nd; ++i) { // for each variable
			if (m_state[i] == m_dims[i]) { // if we reached the maximum, wrap around to 1
				m_state[i] = 1;          // subtract wrap value from position
				if (!m_skipped[i])
					m_idx -= m_subtract[i]; // and continue to next variable in sequence
			} else {                    // otherwise, increment variable index
				++m_state[i];             // add to our current position
				if (!m_skipped[i])
					m_idx += m_add[i];   // and break (leave later vars the same)
				break;
			}
		}
		return *this;
	}